

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

Position __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IndexOfLength(CordRepBtree *this,size_t n)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Position PVar5;
  
  uVar2 = (this->super_CordRep).length;
  if (n <= uVar2) {
    PVar5.index = (ulong)(this->super_CordRep).storage[2];
    uVar2 = uVar2 - n;
    do {
      uVar4 = uVar2;
      lVar1 = PVar5.index * 8;
      PVar5.index = PVar5.index - 1;
      uVar3 = **(ulong **)((this->super_CordRep).storage + lVar1 + -5);
      uVar2 = uVar4 - uVar3;
    } while (uVar3 <= uVar4);
    PVar5.n = uVar3 - uVar4;
    return PVar5;
  }
  __assert_fail("n <= length",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x340,
                "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOfLength(size_t) const"
               );
}

Assistant:

inline CordRepBtree::Position CordRepBtree::IndexOfLength(size_t n) const {
  assert(n <= length);
  size_t index = back();
  size_t strip = length - n;
  while (strip >= edges_[index]->length) strip -= edges_[index--]->length;
  return {index, edges_[index]->length - strip};
}